

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

natwm_error workspace_list_init(natwm_state *state,workspace_list **result)

{
  char *pcVar1;
  config_value *pcVar2;
  void *pvVar3;
  natwm_state *state_00;
  natwm_error nVar4;
  workspace_list *workspace_list;
  size_t sVar5;
  workspace *pwVar6;
  ulong uVar7;
  undefined8 in_R9;
  char **ppcVar8;
  char *__s;
  list *plVar9;
  undefined8 uVar10;
  config_array *local_48;
  config_array *workspace_names;
  natwm_state *local_38;
  
  uVar10 = 0x109209;
  local_48 = (config_array *)0x0;
  config_find_array(state->config,"workspaces",&local_48);
  workspace_list = workspace_list_create(10);
  nVar4 = MEMORY_ALLOCATION_ERROR;
  if (workspace_list != (workspace_list *)0x0) {
    ppcVar8 = DEFAULT_WORKSPACE_NAMES;
    uVar7 = 0;
    workspace_names = (config_array *)result;
    local_38 = state;
    do {
      pcVar1 = *ppcVar8;
      __s = pcVar1;
      if ((local_48 != (config_array *)0x0) && (uVar7 < local_48->length)) {
        pcVar2 = local_48->values[uVar7];
        if ((pcVar2 == (config_value *)0x0) || (pcVar2->type != STRING)) {
          internal_logger(natwm_logger,LEVEL_WARNING,"Ignoring invalid workspace name",pcVar1);
        }
        else {
          __s = (pcVar2->data).string;
          sVar5 = strlen(__s);
          if (0x32 < sVar5) {
            internal_logger(natwm_logger,LEVEL_WARNING,
                            "Workspace name \'%s\' is too long. Max length is %zu",__s,0x32,in_R9,
                            uVar10);
            __s = pcVar1;
          }
        }
      }
      pwVar6 = workspace_create(__s,uVar7);
      if (pwVar6 == (workspace *)0x0) {
        workspace_list_destroy(workspace_list);
        return MEMORY_ALLOCATION_ERROR;
      }
      workspace_list->workspaces[uVar7] = pwVar6;
      uVar7 = uVar7 + 1;
      ppcVar8 = ppcVar8 + 1;
    } while (uVar7 != 10);
    plVar9 = local_38->monitor_list->monitors;
    uVar7 = 0;
    do {
      plVar9 = (list *)plVar9->head;
      if (plVar9 == (list *)0x0) break;
      if (uVar7 < workspace_list->count) {
        pwVar6 = workspace_list->workspaces[uVar7];
      }
      else {
        pwVar6 = (workspace *)0x0;
      }
      if (pwVar6 == (workspace *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find workspace for monitor");
      }
      else {
        pvVar3 = (void *)plVar9->size;
        if (uVar7 == 0) {
          workspace_list->active_index = 0;
          pwVar6->is_focused = true;
        }
        pwVar6->is_visible = true;
        *(workspace **)((long)pvVar3 + 0x18) = pwVar6;
        uVar7 = uVar7 + 1;
      }
    } while (pwVar6 != (workspace *)0x0);
    state_00 = local_38;
    ewmh_update_current_desktop(local_38,workspace_list->active_index);
    ewmh_update_desktop_names(state_00,workspace_list);
    reset_input_focus(state_00);
    workspace_names->length = (size_t)workspace_list;
    nVar4 = NO_ERROR;
  }
  return nVar4;
}

Assistant:

enum natwm_error workspace_list_init(const struct natwm_state *state,
                                     struct workspace_list **result)
{
        // First get the list of workspace names
        const struct config_array *workspace_names = NULL;

        config_find_array(state->config, "workspaces", &workspace_names);

        struct workspace_list *workspace_list = workspace_list_create(NATWM_WORKSPACE_COUNT);

        if (workspace_list == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < NATWM_WORKSPACE_COUNT; ++i) {
                struct workspace *workspace = workspace_init(workspace_names, i);

                if (workspace == NULL) {
                        workspace_list_destroy(workspace_list);

                        return MEMORY_ALLOCATION_ERROR;
                }

                workspace_list->workspaces[i] = workspace;
        }

        attach_to_monitors(state->monitor_list, workspace_list);

        ewmh_update_current_desktop(state, workspace_list->active_index);
        ewmh_update_desktop_names(state, workspace_list);

        reset_input_focus(state);

        *result = workspace_list;

        return NO_ERROR;
}